

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O0

void __thiscall xs::TcpServer::TcpServer(TcpServer *this,deSocketFamily family,int port)

{
  int __n;
  SocketAddress local_30;
  SocketAddress address;
  int port_local;
  deSocketFamily family_local;
  TcpServer *this_local;
  
  this->_vptr_TcpServer = (_func_int **)&PTR__TcpServer_0015f910;
  de::Socket::Socket(&this->m_socket);
  de::Mutex::Mutex(&this->m_connectionListLock,0);
  std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::vector
            (&this->m_liveConnections);
  std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::vector
            (&this->m_doneConnections);
  de::SocketAddress::SocketAddress(&local_30);
  de::SocketAddress::setFamily(&local_30,family);
  de::SocketAddress::setPort(&local_30,port);
  de::SocketAddress::setType(&local_30,DE_SOCKETTYPE_STREAM);
  de::SocketAddress::setProtocol(&local_30,DE_SOCKETPROTOCOL_TCP);
  de::Socket::listen(&this->m_socket,(int)&local_30,__n);
  de::Socket::setFlags(&this->m_socket,8);
  de::SocketAddress::~SocketAddress(&local_30);
  return;
}

Assistant:

TcpServer::TcpServer (deSocketFamily family, int port)
	: m_socket()
{
	de::SocketAddress address;
	address.setFamily(family);
	address.setPort(port);
	address.setType(DE_SOCKETTYPE_STREAM);
	address.setProtocol(DE_SOCKETPROTOCOL_TCP);

	m_socket.listen(address);
	m_socket.setFlags(DE_SOCKET_CLOSE_ON_EXEC);
}